

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
* __thiscall wallet::CWallet::GetNewDestination(CWallet *this,OutputType type,string *label)

{
  ConstevalStringLiteral str;
  bool bVar1;
  ScriptPubKeyMan *args;
  string *in_RCX;
  uint in_EDX;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  ScriptPubKeyMan *spk_man;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *op_dest;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock54;
  bilingual_str *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  OutputType in_stack_fffffffffffffec4;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined1 internal;
  OutputType *in_stack_fffffffffffffed8;
  CWallet *in_stack_fffffffffffffee0;
  CWallet *this_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  optional<wallet::AddressPurpose> local_a0 [19];
  long local_8;
  
  internal = (undefined1)((ulong)in_stack_fffffffffffffed0 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffeb8);
  uVar2 = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00,
             (AnnotatedMixin<std::recursive_mutex> *)in_RDI,(char *)in_RCX,
             (char *)in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x18,0));
  args = GetScriptPubKeyMan(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(bool)internal);
  if (args == (ScriptPubKeyMan *)0x0) {
    str.lit._4_4_ = uVar2;
    str.lit._0_4_ = in_stack_ffffffffffffff08;
    ::_(str);
    FormatOutputType_abi_cxx11_(in_stack_fffffffffffffec4);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    util::
    Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
    ::Result(in_stack_fffffffffffffec8,
             (Error *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    util::Error::~Error((Error *)in_stack_fffffffffffffeb8);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffeb8);
  }
  else {
    (*args->_vptr_ScriptPubKeyMan[2])(in_RDI,args,(ulong)in_EDX);
    bVar1 = util::Result::operator_cast_to_bool
                      ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                        *)in_stack_fffffffffffffeb8);
    if (bVar1) {
      util::
      Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
      ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                   *)in_stack_fffffffffffffeb8);
      std::optional<wallet::AddressPurpose>::optional<wallet::AddressPurpose,_true>
                (local_a0,(AddressPurpose *)
                          CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      SetAddressBook(this_00,(CTxDestination *)in_RDI,in_RCX,
                     (optional<wallet::AddressPurpose> *)in_stack_fffffffffffffee0);
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
            *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTxDestination> CWallet::GetNewDestination(const OutputType type, const std::string label)
{
    LOCK(cs_wallet);
    auto spk_man = GetScriptPubKeyMan(type, /*internal=*/false);
    if (!spk_man) {
        return util::Error{strprintf(_("Error: No %s addresses available."), FormatOutputType(type))};
    }

    auto op_dest = spk_man->GetNewDestination(type);
    if (op_dest) {
        SetAddressBook(*op_dest, label, AddressPurpose::RECEIVE);
    }

    return op_dest;
}